

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintingTheDecimalEquivalentOfABinaryNumber.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong in_RAX;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  undefined8 local_38;
  
  local_38 = in_RAX;
  printf("%s","Enter a valid binary number (up to 5 digits): ");
  __isoc99_scanf("%d",&local_38);
  do {
    bVar6 = false;
    uVar7 = 0;
    while( true ) {
      if (bVar6) {
        printf("%s%d","The decimal equivalent is: ",(ulong)uVar7);
        return 0;
      }
      if (((int)(uint)local_38 < 0) || (0x2b67 < (uint)local_38)) break;
      uVar7 = (uint)local_38 - 10000;
      uVar2 = (uint)local_38;
      if (9999 < (uint)local_38) {
        uVar2 = uVar7;
      }
      uVar1 = (uVar2 & 0xffff) % 1000;
      uVar4 = (ushort)(uVar1 % 100);
      bVar3 = (byte)(uVar4 % 10);
      uVar5 = (uint)bVar3;
      local_38 = CONCAT44(local_38._4_4_,uVar5);
      uVar7 = (uint)(uVar7 < 10000) << 4;
      if (uVar2 - 1000 < 1000) {
        uVar7 = uVar7 | 8;
      }
      else if (999 < uVar2) {
        local_38 = (ulong)CONCAT14(bVar3,uVar5);
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",&local_38);
        uVar5 = local_38._4_4_;
      }
      if (uVar1 - 100 < 100) {
        uVar7 = uVar7 + 4;
      }
      else if (99 < (ushort)uVar1) {
        local_38 = CONCAT44(uVar5,(uint)local_38);
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",&local_38);
        uVar5 = local_38._4_4_;
      }
      if (uVar1 % 100 - 10 < 10) {
        uVar7 = uVar7 + 2;
      }
      else if (9 < uVar4) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",&local_38);
      }
      bVar6 = true;
      if ((char)uVar5 != '\0') {
        if ((uVar5 & 0xff) == 1) {
          uVar7 = uVar7 + 1;
        }
        else {
          puts("You have not entered a binary number");
          bVar6 = false;
          printf("%s","Enter a valid binary number (up to 5 digits): ");
          __isoc99_scanf("%d",&local_38);
        }
      }
    }
    puts("You have not entered a binary number");
    printf("%s","Enter a valid binary number (up to 5 digits): ");
    __isoc99_scanf("%d",&local_38);
  } while( true );
}

Assistant:

int main (void) {
    int number;
    int flag = 1;
    int numA;
    int numB;
    int numC;
    int numD;
    int numE;
    int decimal = 0;

    printf("%s", "Enter a valid binary number (up to 5 digits): ");
    scanf("%d", &number);
    while (flag != -1) {
        decimal = 0;
        if (number >= 0) {
            if (number <= 11111) {
                numA = number / 10000;
                number = number % 10000;
                numB = number / 1000;
                number = number % 1000;
                numC = number / 100;
                number = number % 100;
                numD = number / 10;
                number = number % 10;
                numE = number;
                if (numA == 1) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else if (numA == 0) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numB == 1) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else if (numB == 0) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numC == 1) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else if (numC == 0) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numD == 1) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else if (numD == 0) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numE == 1) {
                    decimal = decimal + numE ;
                    flag = -1;

                }
                else if (numE == 0) {
                    decimal = decimal + numE;
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

            }
            else {
                puts("You have not entered a binary number");
                printf("%s", "Enter a valid binary number (up to 5 digits): ");
                scanf("%d", &number);
                flag = 1;

            }

        }
        else {
            puts("You have not entered a binary number");
            printf("%s", "Enter a valid binary number (up to 5 digits): ");
            scanf("%d", &number);
            flag = 1;

        }

    }
    printf("%s%d", "The decimal equivalent is: ", decimal);

    return 0;

}